

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Font.cpp
# Opt level: O1

float __thiscall sf::Font::getKerning(Font *this,Uint32 first,Uint32 second,uint characterSize)

{
  void *pvVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  float fVar5;
  FT_Vector kerning;
  long local_30 [2];
  
  fVar5 = 0.0;
  if (((second != 0 && first != 0) && (pvVar1 = this->m_face, pvVar1 != (void *)0x0)) &&
     ((*(byte *)((long)pvVar1 + 0x10) & 0x40) != 0)) {
    bVar2 = setCurrentSize(this,characterSize);
    fVar5 = 0.0;
    if (bVar2) {
      uVar3 = FT_Get_Char_Index(pvVar1,first);
      uVar4 = FT_Get_Char_Index(pvVar1,second);
      FT_Get_Kerning(pvVar1,uVar3,uVar4,0,local_30);
      fVar5 = (float)local_30[0];
      if ((*(byte *)((long)pvVar1 + 0x10) & 1) != 0) {
        fVar5 = fVar5 * 0.015625;
      }
    }
  }
  return fVar5;
}

Assistant:

float Font::getKerning(Uint32 first, Uint32 second, unsigned int characterSize) const
{
    // Special case where first or second is 0 (null character)
    if (first == 0 || second == 0)
        return 0.f;

    FT_Face face = static_cast<FT_Face>(m_face);

    if (face && FT_HAS_KERNING(face) && setCurrentSize(characterSize))
    {
        // Convert the characters to indices
        FT_UInt index1 = FT_Get_Char_Index(face, first);
        FT_UInt index2 = FT_Get_Char_Index(face, second);

        // Get the kerning vector
        FT_Vector kerning;
        FT_Get_Kerning(face, index1, index2, FT_KERNING_DEFAULT, &kerning);

        // X advance is already in pixels for bitmap fonts
        if (!FT_IS_SCALABLE(face))
            return static_cast<float>(kerning.x);

        // Return the X advance
        return static_cast<float>(kerning.x) / static_cast<float>(1 << 6);
    }
    else
    {
        // Invalid font, or no kerning
        return 0.f;
    }
}